

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaPf.c
# Opt level: O2

void Pf_CutParams(Pf_Man_t *p,Pf_Cut_t *pCut,int nGiaRefs)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  float fVar6;
  float fVar7;
  
  uVar1 = *(uint *)&pCut->field_0x10;
  uVar4 = uVar1 >> 0x1b;
  if ((int)uVar4 <= p->pPars->nLutSize) {
    pCut->Delay = 0;
    pCut->Flow = 0.0;
    fVar6 = 0.0;
    for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      iVar2 = pCut->Delay;
      iVar3 = Vec_IntEntry(&p->vCutDelays,pCut->pLeaves[uVar5]);
      if (iVar3 < iVar2) {
        iVar3 = iVar2;
      }
      pCut->Delay = iVar3;
      fVar6 = Pf_ObjCutFlow(p,pCut->pLeaves[uVar5]);
      fVar6 = fVar6 + pCut->Flow;
      pCut->Flow = fVar6;
    }
    pCut->Delay = (pCut->Delay + 1) - (uint)(uVar1 < 0x10000000);
    fVar7 = 0.0;
    if (0xfffffff < uVar1) {
      fVar7 = (float)(int)(uVar4 + p->pPars->nAreaTuner);
    }
    pCut->Flow = (fVar6 + fVar7) / (float)(int)(nGiaRefs + (uint)(nGiaRefs == 0));
    return;
  }
  __assert_fail("nLeaves <= p->pPars->nLutSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaPf.c"
                ,0x2fe,"void Pf_CutParams(Pf_Man_t *, Pf_Cut_t *, int)");
}

Assistant:

static inline void Pf_CutParams( Pf_Man_t * p, Pf_Cut_t * pCut, int nGiaRefs )
{
    int i, nLeaves = pCut->nLeaves; 
    assert( nLeaves <= p->pPars->nLutSize );
    pCut->Delay = 0;
    pCut->Flow  = 0;
    for ( i = 0; i < nLeaves; i++ )
    {
        pCut->Delay = Abc_MaxInt( pCut->Delay, Pf_ObjCutDelay(p, pCut->pLeaves[i]) );
        pCut->Flow += Pf_ObjCutFlow(p, pCut->pLeaves[i]);
    }
    pCut->Delay += (int)(nLeaves > 1);
    pCut->Flow = (pCut->Flow + Pf_CutArea(p, nLeaves)) / (nGiaRefs ? nGiaRefs : 1);
}